

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUnit.h
# Opt level: O0

void __thiscall
QUnit::UnitTest::evaluate
          (UnitTest *this,bool compare,bool result,string *val1,string *val2,string *str1,
          string *str2,char *file,int line,char *func)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_b8;
  char *local_b0;
  __type local_99;
  allocator local_59;
  string local_58 [8];
  string cmp;
  bool ok;
  string *str1_local;
  string *val2_local;
  string *val1_local;
  bool result_local;
  bool compare_local;
  UnitTest *this_local;
  
  if (result) {
    local_99 = std::operator==(val1,val2);
  }
  else {
    local_99 = std::operator!=(val1,val2);
  }
  this->tests_ = this->tests_ + 1;
  this->errors_ = (uint)(local_99 == false) + this->errors_;
  if (((local_99 == false) || (2 < this->verboseLevel_)) && (this->verboseLevel_ != 0)) {
    poVar1 = std::operator<<(this->out_,file);
    if (local_99 == false) {
      local_b0 = ":";
    }
    else {
      local_b0 = ";";
    }
    poVar1 = std::operator<<(poVar1,local_b0);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
    std::operator<<(poVar1,": ");
    pcVar2 = "FAILED/";
    if (local_99 != false) {
      pcVar2 = "OK/";
    }
    poVar1 = std::operator<<(this->out_,pcVar2);
    poVar1 = std::operator<<(poVar1,func);
    std::operator<<(poVar1,"(): ");
    if (compare) {
      if (result) {
        local_b8 = "==";
      }
      else {
        local_b8 = "!=";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,local_b8,&local_59);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      poVar1 = std::operator<<(this->out_,"compare {");
      poVar1 = std::operator<<(poVar1,(string *)str1);
      poVar1 = std::operator<<(poVar1,"} ");
      poVar1 = std::operator<<(poVar1,local_58);
      poVar1 = std::operator<<(poVar1," {");
      poVar1 = std::operator<<(poVar1,(string *)str2);
      poVar1 = std::operator<<(poVar1,"} ");
      poVar1 = std::operator<<(poVar1,"got {\"");
      poVar1 = std::operator<<(poVar1,(string *)val1);
      poVar1 = std::operator<<(poVar1,"\"} ");
      poVar1 = std::operator<<(poVar1,local_58);
      poVar1 = std::operator<<(poVar1," {\"");
      poVar1 = std::operator<<(poVar1,(string *)val2);
      std::operator<<(poVar1,"\"}");
      std::__cxx11::string::~string(local_58);
    }
    else {
      poVar1 = std::operator<<(this->out_,"evaluate {");
      poVar1 = std::operator<<(poVar1,(string *)str1);
      poVar1 = std::operator<<(poVar1,"} == ");
      std::operator<<(poVar1,(string *)val1);
    }
    std::ostream::operator<<(this->out_,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

inline void UnitTest::evaluate(
        bool compare, bool result,
        std::string val1, std::string val2,
        std::string str1, std::string str2,
        const char * file, int line, const char * func) {

        bool ok = result ? (val1 == val2) : (val1 != val2);
        tests_ += 1;
        errors_ += ok ? 0 : 1;

        if( (ok && !(verboseLevel_ > normal)) || verboseLevel_ == silent )
            return;

        out_ << file << ( ok ? ";" : ":" ) << line << ": ";
        out_ << ( ok ? "OK/" : "FAILED/" ) << func << "(): ";
        if( compare ) {
            const std::string cmp = ( result ? "==" : "!=" );
            out_ << "compare {" << str1 << "} " << cmp << " {" <<  str2 << "} "
                 << "got {\"" << val1 << "\"} " << cmp << " {\"" << val2 << "\"}";
        } else {
            out_ << "evaluate {" << str1 << "} == " << val1;
        }
        out_ << std::endl;
    }